

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O2

string * ArrVarName(string *__return_storage_ptr__,int am1,int am2,string *ketstr,string *prefix)

{
  string str;
  string local_30;
  
  StringBuilder<char[6],char_const&,char_const(&)[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
            (&local_30,(char (*) [6])"INT__",
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + am1,
             (char (*) [2])0x139cb8,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + am2,
             (char (*) [2])0x139cb8,ketstr);
  if (prefix->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_30._M_string_length;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,prefix,(char (*) [2])0x139cb8,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ArrVarName(int am1, int am2, const std::string & ketstr, const std::string & prefix = "")
{
    std::string str = StringBuilder("INT__" , amchar[am1], "_", amchar[am2], "_", ketstr);
    
    if(prefix.size())
        return StringBuilder(prefix, "_", str);
    else
        return str;
}